

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

unsigned_long __thiscall CTPNStmForBase::get_control_flow(CTPNStmForBase *this,int warn)

{
  int iVar1;
  CTcConstVal *pCVar2;
  undefined4 extraout_var;
  uint in_ESI;
  CTPNStmBase *in_RDI;
  unsigned_long flags;
  CTcConstVal *in_stack_ffffffffffffffe0;
  ulong uVar3;
  
  if ((in_RDI[1].file_ != (CTcTokFileDesc *)0x0) &&
     (iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26f7ae), iVar1 != 0)) {
    (**(code **)(*(long *)in_RDI[1].file_ + 8))();
    iVar1 = CTcConstVal::get_val_bool(in_stack_ffffffffffffffe0);
    if (((iVar1 == 0) &&
        (((in_RDI[1].linenum_ != 0 || (in_RDI[2].next_stm_ != (CTPNStm *)0x0)) &&
         (in_RDI[2].next_stm_ != (CTPNStm *)0x0)))) &&
       ((iVar1 = (*((in_RDI[2].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                   _vptr_CTcPrsNodeBase[0x1d])(), iVar1 == 0 &&
        (iVar1 = CTcParser::get_syntax_only(G_prs), iVar1 == 0)))) {
      if (in_ESI != 0) {
        pCVar2 = (CTcConstVal *)(**(code **)(*(long *)in_RDI[1].file_ + 8))();
        iVar1 = CTcConstVal::is_ctc(pCVar2);
        if (iVar1 == 0) {
          CTPNStmBase::log_warning(in_RDI,0x2b3e);
        }
      }
      return 1;
    }
  }
  if (in_RDI[2].next_stm_ == (CTPNStm *)0x0) {
    uVar3 = 0;
  }
  else {
    iVar1 = (*((in_RDI[2].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x1c])(in_RDI[2].next_stm_,(ulong)in_ESI);
    uVar3 = CONCAT44(extraout_var,iVar1);
  }
  pCVar2 = (CTcConstVal *)(uVar3 & 0xfffffffffffffffe);
  if ((uVar3 & 0x20) != 0) {
    pCVar2 = (CTcConstVal *)((ulong)pCVar2 | 1);
  }
  if (in_RDI[1].file_ == (CTcTokFileDesc *)0x0) goto LAB_0026f914;
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26f8d4);
  if (iVar1 != 0) {
    iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26f8e6);
    if (iVar1 == 0) goto LAB_0026f914;
    (**(code **)(*(long *)in_RDI[1].file_ + 8))();
    iVar1 = CTcConstVal::get_val_bool(pCVar2);
    if (iVar1 != 0) goto LAB_0026f914;
  }
  pCVar2 = (CTcConstVal *)((ulong)pCVar2 | 1);
LAB_0026f914:
  if (in_RDI[2].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pCVar2 = (CTcConstVal *)((ulong)pCVar2 | 1);
  }
  return (ulong)pCVar2 & 0xffffffffffffff9f;
}

Assistant:

unsigned long CTPNStmForBase::get_control_flow(int warn) const
{
    unsigned long flags;

    /*
     *   If we have a condition with a constant false value, and there's
     *   either a reinitialization expression or a loop body, warn about the
     *   unreachable code.  If the body is directly reachable via a code
     *   label, we don't need this warning.
     */
    if (cond_expr_ != 0
        && cond_expr_->is_const()
        && !cond_expr_->get_const_val()->get_val_bool()
        && (reinit_expr_ != 0 || body_stm_ != 0)
        && (body_stm_ != 0 && !body_stm_->has_code_label())
        && !G_prs->get_syntax_only())
    {
        /* log a warning if desired */
        if (warn && !cond_expr_->get_const_val()->is_ctc())
            log_warning(TCERR_FOR_COND_FALSE);

        /* this will simply continue to the next statement */
        return TCPRS_FLOW_NEXT;
    }

    /* check for a body */
    if (body_stm_ != 0)
    {
        /* determine how our body can exit */
        flags = body_stm_->get_control_flow(warn);
    }
    else
    {
        /* 
         *   We have no body, so it's entirely up to the loop - we'll
         *   evaluate those parameters below, but for now clear all flags 
         */
        flags = 0;
    }

    /* 
     *   ignore any 'next' flag that comes out of the body, because 'next'
     *   from the last statement in the body actually takes us back to the
     *   top of the loop 
     */
    flags &= ~TCPRS_FLOW_NEXT;

    /* 
     *   if there's a 'break' in the body, we can continue to the next
     *   statement, since a break in the body takes us to the statement
     *   after the 'for' 
     */
    if ((flags & TCPRS_FLOW_BREAK) != 0)
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   If we have a condition, and either the condition is a constant
     *   false value or has a non-constant value, assume that the
     *   condition can possibly become false and hence that the loop can
     *   exit, and hence that the next statement is reachable.
     */
    if (cond_expr_ != 0
        && (!cond_expr_->is_const()
            || (cond_expr_->is_const()
                && !cond_expr_->get_const_val()->get_val_bool())))
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   If we have any "in" clauses, we implicitly have a condition that
     *   allows the loop to terminate. 
     */
    if (in_exprs_ != 0)
        flags |= TCPRS_FLOW_NEXT;
    
    /* 
     *   clear the 'break' and 'continue' flags, since we capture them in
     *   our own scope - if our child breaks or continues, it won't affect
     *   the "for" loop's container 
     */
    flags &= ~(TCPRS_FLOW_BREAK | TCPRS_FLOW_CONT);

    /* return the flags */
    return flags;
}